

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_decoder.c
# Opt level: O1

asn_dec_rval_t
uper_decode(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **sptr,void *buffer,
           size_t size,int skip_bits,int unused_bits)

{
  size_t *psVar1;
  asn_dec_rval_t aVar5;
  size_t sVar2;
  ulong uVar3;
  asn_dec_rval_t aVar4;
  asn_per_data_t pd;
  asn_codec_ctx_t local_50;
  asn_per_data_t local_48;
  
  aVar5.code = RC_FAIL;
  aVar5._4_4_ = 0;
  aVar5.consumed = 2;
  if (((uint)(unused_bits | skip_bits) < 8) && (size != 0 || unused_bits < 1)) {
    if (opt_codec_ctx == (asn_codec_ctx_t *)0x0) {
      opt_codec_ctx = &local_50;
      local_50.max_stack_size = 30000;
    }
    else {
      psVar1 = &opt_codec_ctx->max_stack_size;
      if (*psVar1 != 0) {
        opt_codec_ctx = &local_50;
        local_50.max_stack_size = *psVar1;
      }
    }
    local_48.moved = 0;
    local_48.refill = (_func_int_asn_per_data_s_ptr *)0x0;
    local_48.refill_key = (void *)0x0;
    uVar3 = (ulong)(uint)skip_bits;
    local_48.nbits = size * 8 - (ulong)(uint)unused_bits;
    if ((uVar3 <= local_48.nbits) && (td->uper_decoder != (per_type_decoder_f *)0x0)) {
      sVar2 = 0;
      local_48.buffer = (uint8_t *)buffer;
      local_48.nboff = uVar3;
      aVar5._0_8_ = (*td->uper_decoder)(opt_codec_ctx,td,(asn_per_constraints_t *)0x0,sptr,&local_48
                                       );
      if (aVar5.code == RC_OK) {
        sVar2 = (local_48.nboff - uVar3) + ((long)local_48.buffer - (long)buffer) * 8;
      }
      goto LAB_0014d83d;
    }
  }
  sVar2 = 0;
LAB_0014d83d:
  aVar4.consumed = sVar2;
  aVar4._0_8_ = (undefined8)aVar5._0_8_;
  return aVar4;
}

Assistant:

asn_dec_rval_t
uper_decode(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td, void **sptr, const void *buffer, size_t size, int skip_bits, int unused_bits) {
	asn_codec_ctx_t s_codec_ctx;
	asn_dec_rval_t rval;
	asn_per_data_t pd;

	if(skip_bits < 0 || skip_bits > 7
	|| unused_bits < 0 || unused_bits > 7
	|| (unused_bits > 0 && !size))
		ASN__DECODE_FAILED;

	/*
	 * Stack checker requires that the codec context
	 * must be allocated on the stack.
	 */
	if(opt_codec_ctx) {
		if(opt_codec_ctx->max_stack_size) {
			s_codec_ctx = *opt_codec_ctx;
			opt_codec_ctx = &s_codec_ctx;
		}
	} else {
		/* If context is not given, be security-conscious anyway */
		memset(&s_codec_ctx, 0, sizeof(s_codec_ctx));
		s_codec_ctx.max_stack_size = ASN__DEFAULT_STACK_MAX;
		opt_codec_ctx = &s_codec_ctx;
	}

	/* Fill in the position indicator */
	memset(&pd, 0, sizeof(pd));
	pd.buffer = (const uint8_t *)buffer;
	pd.nboff = skip_bits;
	pd.nbits = 8 * size - unused_bits; /* 8 is CHAR_BIT from <limits.h> */
	if(pd.nboff > pd.nbits)
		ASN__DECODE_FAILED;

	/*
	 * Invoke type-specific decoder.
	 */
	if(!td->uper_decoder)
		ASN__DECODE_FAILED;	/* PER is not compiled in */
	rval = td->uper_decoder(opt_codec_ctx, td, 0, sptr, &pd);
	if(rval.code == RC_OK) {
		/* Return the number of consumed bits */
		rval.consumed = ((pd.buffer - (const uint8_t *)buffer) << 3)
					+ pd.nboff - skip_bits;
		ASN_DEBUG("PER decoding consumed %ld, counted %ld",
			(long)rval.consumed, (long)pd.moved);
		assert(rval.consumed == pd.moved);
	} else {
		/* PER codec is not a restartable */
		rval.consumed = 0;
	}
	return rval;
}